

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

int run_container_rank(run_container_t *container,uint16_t x)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint32_t x32;
  uint uVar4;
  undefined6 in_register_00000032;
  long lVar5;
  
  if ((long)container->n_runs < 1) {
    return 0;
  }
  lVar5 = 0;
  iVar3 = 0;
  do {
    uVar1 = container->runs[lVar5].value;
    uVar2 = container->runs[lVar5].length;
    uVar4 = (uint)CONCAT62(in_register_00000032,x);
    if (uVar4 <= (uint)uVar2 + (uint)uVar1) {
      if (x < uVar1) {
        return iVar3;
      }
      return ((uVar4 + iVar3) - (uint)uVar1) + 1;
    }
    iVar3 = iVar3 + (uint)uVar2 + 1;
    lVar5 = lVar5 + 1;
  } while (container->n_runs != lVar5);
  return iVar3;
}

Assistant:

int run_container_rank(const run_container_t *container, uint16_t x) {
    int sum = 0;
    uint32_t x32 = x;
    for (int i = 0; i < container->n_runs; i++) {
        uint32_t startpoint = container->runs[i].value;
        uint32_t length = container->runs[i].length;
        uint32_t endpoint = length + startpoint;
        if (x <= endpoint) {
            if (x < startpoint) break;
            return sum + (x32 - startpoint) + 1;
        } else {
            sum += length + 1;
        }
    }
    return sum;
}